

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  Pair *pPVar1;
  Pair *pPVar2;
  void *in_RDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::Pair> *in_RDI;
  Pair *it;
  Pair *it_00;
  ImVector<ImGuiStorage::Pair> *in_stack_ffffffffffffffd0;
  
  pPVar1 = LowerBound(in_RDI,in_ESI);
  it_00 = pPVar1;
  pPVar2 = ImVector<ImGuiStorage::Pair>::end(in_RDI);
  if ((it_00 == pPVar2) || (pPVar1->key != in_ESI)) {
    Pair::Pair((Pair *)&stack0xffffffffffffffd0,in_ESI,in_RDX);
    ImVector<ImGuiStorage::Pair>::insert(in_stack_ffffffffffffffd0,it_00,(Pair *)in_RDI);
  }
  else {
    (pPVar1->field_1).val_p = in_RDX;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_p = val;
}